

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smatrix.h
# Opt level: O1

basic_ostream<char,_std::char_traits<char>_> *
gmath::operator<<(basic_ostream<char,_std::char_traits<char>_> *out,SMatrix<double,_3,_3> *a)

{
  long lVar1;
  long lVar2;
  double *pdVar3;
  
  std::__ostream_insert<char,std::char_traits<char>>(out,"[",1);
  pdVar3 = a->v[0] + 1;
  lVar1 = 0;
  do {
    std::ostream::_M_insert<double>(a->v[lVar1][0]);
    lVar2 = 0;
    do {
      std::__ostream_insert<char,std::char_traits<char>>(out," ",1);
      std::ostream::_M_insert<double>(pdVar3[lVar2]);
      lVar2 = lVar2 + 1;
    } while (lVar2 != 2);
    if (lVar1 != 2) {
      std::__ostream_insert<char,std::char_traits<char>>(out,"; ",2);
    }
    lVar1 = lVar1 + 1;
    pdVar3 = pdVar3 + 3;
  } while (lVar1 != 3);
  std::__ostream_insert<char,std::char_traits<char>>(out,"]",1);
  return out;
}

Assistant:

std::basic_ostream<Ch, Tr> &operator<<(std::basic_ostream<Ch, Tr> &out,
                                       const SMatrix<T, nrows, ncols> &a)
{
  out << "[";

  for (int k=0; k<nrows; k++)
  {
    out << a(k, 0);

    for (int i=1; i<ncols; i++)
    {
      out << " " << a(k, i);
    }

    if (k+1 < nrows)
    {
      out << "; ";
    }
  }

  out << "]";

  return out;
}